

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_udata.c
# Opt level: O0

GCudata * lj_udata_new(lua_State *L,MSize sz,GCtab *env)

{
  GCudata *pGVar1;
  ulong uVar2;
  void *in_RDX;
  MSize in_ESI;
  long in_RDI;
  global_State *g;
  GCudata *ud;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  pGVar1 = (GCudata *)
           lj_mem_realloc((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                          (GCSize)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                          (GCSize)in_stack_ffffffffffffffe0);
  uVar2 = (ulong)*(uint *)(in_RDI + 8);
  pGVar1->marked = *(byte *)(uVar2 + 0x58) & 3;
  pGVar1->gct = '\f';
  pGVar1->udtype = '\0';
  pGVar1->len = in_ESI;
  (pGVar1->metatable).gcptr32 = 0;
  (pGVar1->env).gcptr32 = (uint32_t)in_RDX;
  (pGVar1->nextgc).gcptr32 = *(uint32_t *)(ulong)*(uint *)(uVar2 + 0x110);
  *(int *)(ulong)*(uint *)(uVar2 + 0x110) = (int)pGVar1;
  *(long *)(uVar2 + 0xd8) = *(long *)(uVar2 + 0xd8) + 1;
  return pGVar1;
}

Assistant:

GCudata *lj_udata_new(lua_State *L, MSize sz, GCtab *env)
{
  GCudata *ud = lj_mem_newt(L, sizeof(GCudata) + sz, GCudata);
  global_State *g = G(L);
  newwhite(g, ud);  /* Not finalized. */
  ud->gct = ~LJ_TUDATA;
  ud->udtype = UDTYPE_USERDATA;
  ud->len = sz;
  /* NOBARRIER: The GCudata is new (marked white). */
  setgcrefnull(ud->metatable);
  setgcref(ud->env, obj2gco(env));
  /* Chain to userdata list (after main thread). */
  setgcrefr(ud->nextgc, mainthread(g)->nextgc);
  setgcref(mainthread(g)->nextgc, obj2gco(ud));
  g->gc.udatanum++;
  return ud;
}